

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs_connection.cpp
# Opt level: O2

void __thiscall
mysqlhs::connection::split
          (connection *this,string *s,char c,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v)

{
  istream *piVar1;
  string item;
  stringstream ss;
  value_type local_1c8;
  stringstream local_1a8 [24];
  string local_190 [368];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringbuf::str(local_190);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,c);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(v,&local_1c8);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void connection::split(const std::string& s, char c, std::vector<std::string>& v)
	{
		std::stringstream ss;
		ss.str(s);

		std::string item;
		while (std::getline(ss, item, c))
		{
			v.push_back(item);
		}
	}